

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_SEND_TCP_DATA_check(void)

{
  int32_t iVar1;
  uint8_t local_154 [8];
  uint8_t buf5 [6];
  uint8_t buf4 [5];
  uint8_t buf3 [11];
  uint8_t buf2 [11];
  uint8_t buf1 [11];
  PipeMsg msg;
  
  MsgHelper::initMsg((PipeMsg *)(buf1 + 3),SEND_TCP_DATA);
  buf2[3] = '\x03';
  buf2[4] = '\x02';
  buf2[5] = '\0';
  buf2[6] = '\0';
  buf2[7] = '\0';
  buf2[8] = '\n';
  buf2[9] = '\x01';
  buf2[10] = '\x02';
  buf1[0] = '\x03';
  buf1[1] = '\x04';
  buf1[2] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(buf2 + 3,0xb,(PipeMsg *)(buf1 + 3));
  if (iVar1 != 10) {
    __assert_fail("MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xf5,"void test_SEND_TCP_DATA_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)(buf1 + 3));
  buf3[3] = '\x03';
  buf3[4] = '\0';
  buf3[5] = '\0';
  buf3[6] = '\0';
  buf3[7] = '\0';
  buf3[8] = '\n';
  buf3[9] = '\x01';
  buf3[10] = '\x02';
  buf2[0] = '\x03';
  buf2[1] = '\x04';
  buf2[2] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(buf3 + 3,0xb,(PipeMsg *)(buf1 + 3));
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xfa,"void test_SEND_TCP_DATA_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)(buf1 + 3));
  stack0xfffffffffffffeb7 = 0x201060000000203;
  buf3[0] = '\x03';
  buf3[1] = '\x04';
  buf3[2] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(buf5 + 3,0xb,(PipeMsg *)(buf1 + 3));
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xff,"void test_SEND_TCP_DATA_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)(buf1 + 3));
  stack0xfffffffffffffeb2 = 0x3030203;
  buf5[2] = '\x03';
  iVar1 = MsgHelper::deserializeMsg(local_154 + 6,5,(PipeMsg *)(buf1 + 3));
  if (iVar1 == 0) {
    MsgHelper::destroyMsg((PipeMsg *)(buf1 + 3));
    builtin_memcpy(local_154,"\x03\x02\x03\x13#3",6);
    iVar1 = MsgHelper::deserializeMsg(local_154,6,(PipeMsg *)(buf1 + 3));
    if (iVar1 == -1) {
      MsgHelper::destroyMsg((PipeMsg *)(buf1 + 3));
      return;
    }
    __assert_fail("MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x108,"void test_SEND_TCP_DATA_check()");
  }
  __assert_fail("MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0x103,"void test_SEND_TCP_DATA_check()");
}

Assistant:

void test_SEND_TCP_DATA_check()
{
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::SEND_TCP_DATA);
	
	const uint8_t buf1[] = {0x03, 0x02, 0x00, 0x00, 0x00, 0x0A, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 10);
	MsgHelper::destroyMsg(&msg);
	
	// error: method(0x00)
	const uint8_t buf2[] = {0x03, 0x00, 0x00, 0x00, 0x00, 0x0A, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x06) < min
	const uint8_t buf3[] = {0x03, 0x02, 0x00, 0x00, 0x00, 0x06, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	const uint8_t buf4[] = {0x03, 0x02, 0x03, 0x03, 0x03};
	assert(MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0);
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x03131233) overflow
	const uint8_t buf5[] = {0x03, 0x02, 0x03, 0x13, 0x23, 0x33};
	assert(MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
}